

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode __thiscall JSONNode::as_node(JSONNode *this)

{
  uchar uVar1;
  JSONNode *in_RSI;
  JSONNode *this_local;
  JSONNode *res;
  
  uVar1 = type(in_RSI);
  if (uVar1 == '\x05') {
    JSONNode(this,in_RSI);
  }
  else {
    uVar1 = type(in_RSI);
    if (uVar1 == '\x04') {
      duplicate(this);
      this->internal->_type = '\x05';
    }
    else {
      JSONNode(this,'\x05');
    }
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::as_node(void) const json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (type() == JSON_NODE){
		  return *this;
	   } else if (type() == JSON_ARRAY){
		  JSONNode res(duplicate());
		  res.internal -> _type = JSON_NODE;
		  return res;
	   }
	   #ifdef JSON_MUTEX_CALLBACKS
		  if (internal -> mylock != 0){
			 JSONNode res(JSON_NODE);
			 res.set_mutex(internal -> mylock);
			 return res;
		  }
	   #endif
	   return JSONNode(JSON_NODE);
    }